

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntMathCommon.h
# Opt level: O2

bool IntConstMath::Add(IntConstType left,IntConstType right,IRType type,IntConstType *result)

{
  bool bVar1;
  
  *result = left + right;
  bVar1 = true;
  if (!SCARRY8(left,right)) {
    bVar1 = IsValid(left + right,type);
    bVar1 = !bVar1;
  }
  return bVar1;
}

Assistant:

bool IntMathCommon<T>::Add(T left, T right, T *pResult)
{
#if __has_builtin(__builtin_add_overflow)
    return __builtin_add_overflow(left, right, pResult);
#else
    // Overflow occurs when the result has a different sign from both the
    // left and right operands
    *pResult = static_cast<T>(
        static_cast<UnsignedType>(left) + static_cast<UnsignedType>(right));
    return ((left ^ *pResult) & (right ^ *pResult)) < 0;
#endif
}